

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,AlphaNum *f)

{
  reference pcVar1;
  char *pcVar2;
  long lVar3;
  LogMessage *other;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  char *local_68;
  char *out;
  reference local_58;
  char *begin;
  undefined1 local_39;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_39 = 0;
  local_38 = d;
  e_local = c;
  d_local = b;
  c_local = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(c_local);
  strings::AlphaNum::size(d_local);
  strings::AlphaNum::size(e_local);
  strings::AlphaNum::size(local_38);
  strings::AlphaNum::size(e);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (char *)std::__cxx11::string::begin();
  local_58 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  local_68 = Append4(local_58,b_local,c_local,d_local,e_local);
  pcVar2 = Append2(local_68,local_38,e);
  pcVar1 = local_58;
  local_68 = pcVar2;
  lVar3 = std::__cxx11::string::size();
  local_a1 = 0;
  if (pcVar2 != pcVar1 + lVar3) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x5f0);
    local_a1 = 1;
    other = internal::LogMessage::operator<<
                      (&local_a0,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_a2,other);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
                   const AlphaNum &d, const AlphaNum &e, const AlphaNum &f) {
  std::string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append2(out, e, f);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}